

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O2

void __thiscall GibbsSamplerFromHDP::initializeParameters(GibbsSamplerFromHDP *this)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar1;
  pointer puVar2;
  pointer pvVar3;
  pointer puVar4;
  int i_1;
  int j;
  ulong uVar5;
  uint uVar6;
  int i;
  int v;
  ulong uVar7;
  allocator_type local_95;
  value_type_conflict1 local_94;
  _Vector_base<double,_std::allocator<double>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bufVector;
  allocator_type local_5a;
  allocator_type local_59;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_40;
  ulong local_38;
  
  bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->_Tj,(ulong)this->_J,(value_type_conflict1 *)&bufVector);
  pvVar1 = this->_frequencyMatrix;
  puVar2 = (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar7 = (ulong)this->_J, uVar5 < uVar7; uVar5 = uVar5 + 1) {
    pvVar3 = (pvVar1->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    for (puVar4 = pvVar3[uVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar4 != *(pointer *)
                   ((long)&pvVar3[uVar5].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data + 8); puVar4 = puVar4 + 1) {
      uVar6 = uVar6 + *puVar4;
    }
    puVar2[uVar5] = uVar6;
  }
  local_40 = &this->_xji;
  uVar5 = 0;
  while (uVar5 < uVar7) {
    bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38 = uVar5;
    for (uVar7 = 0; uVar7 < this->_V; uVar7 = uVar7 + 1) {
      for (uVar6 = 0;
          uVar6 < *(uint *)(*(long *)&(this->_frequencyMatrix->
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data + uVar7 * 4);
          uVar6 = uVar6 + 1) {
        local_90._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_90._M_impl.super__Vector_impl_data._M_start._4_4_,(int)uVar7);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                   (uint *)&local_90);
      }
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(local_40,(value_type *)
                         &bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
    ;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar7 = (ulong)this->_J;
    uVar5 = local_38 + 1;
  }
  for (uVar5 = 0; uVar5 < uVar7; uVar5 = uVar5 + 1) {
    bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar6 = 0;
        uVar6 < (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5]; uVar6 = uVar6 + 1) {
      local_90._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_90._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                 (uint *)&local_90);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(&this->_tji,
                (value_type *)
                &bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar7 = (ulong)this->_J;
  }
  for (uVar6 = 0; uVar6 < (uint)uVar7; uVar6 = uVar6 + 1) {
    local_90._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_90._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,1,
               (value_type_conflict1 *)&local_90,(allocator_type *)&local_58);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(&this->_kjt,
                (value_type *)
                &bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(&this->_njt,
                (value_type *)
                &bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar7 = (ulong)this->_J;
  }
  uVar6 = this->_K;
  local_58._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,(ulong)this->_V,
             (value_type_conflict1 *)&local_58,(allocator_type *)&local_94);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&bufVector,(ulong)uVar6,(value_type *)&local_90,&local_95);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_M_move_assign(&this->_nkv,
                   (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&bufVector);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bufVector);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
  uVar6 = this->_K;
  local_58._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,(ulong)this->_V,
             (value_type_conflict1 *)&local_58,(allocator_type *)&local_94);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&bufVector,(ulong)uVar6,(value_type *)&local_90,&local_95);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_M_move_assign(&this->_nkv,
                   (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&bufVector);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bufVector);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
  uVar6 = this->_J;
  local_94 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,(ulong)this->_V,
             &local_94,(allocator_type *)&local_95);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&local_90,1,(value_type *)&local_58,&local_59);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
            *)&bufVector,(ulong)uVar6,(value_type *)&local_90,&local_5a);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::_M_move_assign(&this->_njtv);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             *)&bufVector);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_90);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  uVar6 = 0;
  for (uVar5 = 0; this->_J != uVar5; uVar5 = uVar5 + 1) {
    uVar6 = uVar6 + (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar5];
  }
  local_90._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar6 / this->_K;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
             (ulong)this->_K,(value_type_conflict1 *)&local_90,(allocator_type *)&local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->_nk,&bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  local_90._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_90._M_impl.super__Vector_impl_data._M_start._4_4_,this->_J / this->_K
                        );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
             (ulong)this->_K,(value_type_conflict1 *)&local_90,(allocator_type *)&local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->_mk,&bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  local_90._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&bufVector,(ulong)this->_K,
             (value_type_conflict2 *)&local_90,(allocator_type *)&local_58);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&this->_sumOfNkSampled,(_Vector_base<double,_std::allocator<double>_> *)&bufVector);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&bufVector);
  uVar6 = this->_J;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_90,(ulong)this->_K,
             (value_type_conflict2 *)&local_58,(allocator_type *)&local_94);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&bufVector,(ulong)uVar6,(value_type *)&local_90,(allocator_type *)&local_95);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_move_assign(&this->_sumOfNjkSampled,
                   (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)&bufVector);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&bufVector);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
  uVar6 = this->_K;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_90,(ulong)this->_V,
             (value_type_conflict2 *)&local_58,(allocator_type *)&local_94);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&bufVector,(ulong)uVar6,(value_type *)&local_90,(allocator_type *)&local_95);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_move_assign(&this->_sumOfNkvSampled,
                   (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)&bufVector);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&bufVector);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
  return;
}

Assistant:

void GibbsSamplerFromHDP::initializeParameters(){//{{{
    _Tj.assign(_J, 1);
    for(int j=0; j<_J; j++){
        _nj[j] = accumulate(_frequencyMatrix[j].begin(), _frequencyMatrix[j].end(), 0u);
    }
    // initialize xji with frequencyMatrix
    for(int j=0; j<_J; j++){
        vector<unsigned int> bufVector;
        for(int v=0; v<_V; v++){
            for(int i=0; i<_frequencyMatrix[j][v]; i++){
                bufVector.push_back(v);
            }
        }
        _xji.push_back(bufVector);
    }
    for(int j=0; j<_J; j++){
        vector<unsigned int> bufVector;
        for(int i=0; i<_nj[j]; i++){
            bufVector.push_back(0);
        }
        _tji.push_back(bufVector);
    }
    unsigned int initialTNumber = 1;
    for(int j=0; j<_J; j++){
        vector<unsigned int> bufVector(initialTNumber, 0);
        _kjt.push_back(bufVector);
        _njt.push_back(bufVector);
    }
    _nkv = vector<vector<unsigned int> >(_K, vector<unsigned int>(_V, 0));
    _nkv = vector<vector<unsigned int> >(_K, vector<unsigned int>(_V, 0));
    _njtv = vector<vector<vector<unsigned int> > >(_J, vector<vector<unsigned int> >(initialTNumber, vector<unsigned int>(_V, 0)));
    unsigned int nSum = 0;
    for(int j=0; j<_J; j++){
        nSum += _nj[j];
    }
    _nk = vector<unsigned int>(_K, nSum/_K);
    _mk = vector<unsigned int>(_K, _J * 1 / _K);
    _sumOfNkSampled = vector<double>(_K, 0);
    _sumOfNjkSampled = vector<vector<double> >(_J, vector<double>(_K, 0));
    _sumOfNkvSampled = vector<vector<double> >(_K, vector<double>(_V, 0));
}